

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall duckdb::BaseAppender::AppendDataChunk(BaseAppender *this,DataChunk *chunk_p)

{
  bool bVar1;
  pointer pCVar2;
  unsigned_long params_1;
  reference pvVar3;
  const_reference pvVar4;
  reference pvVar5;
  InvalidInputException *pIVar6;
  size_type __n;
  vector<duckdb::LogicalType,_true> *__y;
  allocator local_111;
  idx_t local_110;
  string error_msg;
  DataChunk cast_chunk;
  vector<duckdb::LogicalType,_true> chunk_types;
  string local_90;
  string local_70;
  string local_50;
  
  DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)
                      &chunk_types.
                       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                      chunk_p);
  __y = &this->active_types;
  if ((this->active_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->active_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __y = &this->types;
  }
  bVar1 = ::std::operator==(&chunk_types.
                             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                            ,&__y->
                              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                           );
  if (bVar1) {
    pCVar2 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
             ::operator->(&this->collection);
    ColumnDataCollection::Append(pCVar2,chunk_p);
    pCVar2 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
             ::operator->(&this->collection);
    if (this->flush_count <= pCVar2->count) {
      Flush(this);
    }
  }
  else {
    params_1 = ((long)(chunk_p->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(chunk_p->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x68;
    if (params_1 !=
        ((long)(__y->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish -
        (long)(__y->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_start) / 0x18) {
      pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&cast_chunk,
                 "incorrect column count in AppendDataChunk, expected %d, got %d",
                 (allocator *)&error_msg);
      InvalidInputException::InvalidInputException<unsigned_long,unsigned_long>
                (pIVar6,(string *)&cast_chunk,
                 ((long)(__y->
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(__y->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ).
                       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18,params_1);
      __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_110 = chunk_p->count;
    DataChunk::DataChunk(&cast_chunk);
    DataChunk::Initialize(&cast_chunk,this->allocator,__y,0x800);
    cast_chunk.count = local_110;
    for (__n = 0; params_1 != __n; __n = __n + 1) {
      pvVar3 = vector<duckdb::Vector,_true>::get<true>(&chunk_p->data,__n);
      pvVar4 = vector<duckdb::LogicalType,_true>::get<true>(__y,__n);
      bVar1 = LogicalType::operator==(&pvVar3->type,pvVar4);
      if (bVar1) {
        pvVar3 = vector<duckdb::Vector,_true>::get<true>(&cast_chunk.data,__n);
        pvVar5 = vector<duckdb::Vector,_true>::get<true>(&chunk_p->data,__n);
        Vector::Reference(pvVar3,pvVar5);
      }
      else {
        error_msg._M_dataplus._M_p = (pointer)&error_msg.field_2;
        error_msg._M_string_length = 0;
        error_msg.field_2._M_local_buf[0] = '\0';
        pvVar3 = vector<duckdb::Vector,_true>::get<true>(&chunk_p->data,__n);
        pvVar5 = vector<duckdb::Vector,_true>::get<true>(&cast_chunk.data,__n);
        bVar1 = VectorOperations::DefaultTryCast(pvVar3,pvVar5,local_110,&error_msg,false);
        if (!bVar1) {
          pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_50,
                     "type mismatch in AppendDataChunk, expected %s, got %s for column %d",
                     &local_111);
          pvVar4 = vector<duckdb::LogicalType,_true>::get<true>(__y,__n);
          LogicalType::ToString_abi_cxx11_(&local_70,pvVar4);
          pvVar3 = vector<duckdb::Vector,_true>::get<true>(&chunk_p->data,__n);
          LogicalType::ToString_abi_cxx11_(&local_90,&pvVar3->type);
          InvalidInputException::
          InvalidInputException<std::__cxx11::string,std::__cxx11::string,unsigned_long>
                    (pIVar6,&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90,
                     __n);
          __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::__cxx11::string::~string((string *)&error_msg);
      }
    }
    pCVar2 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
             ::operator->(&this->collection);
    ColumnDataCollection::Append(pCVar2,&cast_chunk);
    pCVar2 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
             ::operator->(&this->collection);
    if (this->flush_count <= pCVar2->count) {
      Flush(this);
    }
    DataChunk::~DataChunk(&cast_chunk);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&chunk_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  return;
}

Assistant:

void BaseAppender::AppendDataChunk(DataChunk &chunk_p) {
	auto chunk_types = chunk_p.GetTypes();
	auto &appender_types = GetActiveTypes();

	// Early-out, if types match.
	if (chunk_types == appender_types) {
		collection->Append(chunk_p);
		if (collection->Count() >= flush_count) {
			Flush();
		}
		return;
	}

	auto count = chunk_p.ColumnCount();
	if (count != appender_types.size()) {
		throw InvalidInputException("incorrect column count in AppendDataChunk, expected %d, got %d",
		                            appender_types.size(), count);
	}

	// We try to cast the chunk.
	auto size = chunk_p.size();
	DataChunk cast_chunk;
	cast_chunk.Initialize(allocator, appender_types);
	cast_chunk.SetCardinality(size);

	for (idx_t i = 0; i < count; i++) {
		if (chunk_p.data[i].GetType() == appender_types[i]) {
			cast_chunk.data[i].Reference(chunk_p.data[i]);
			continue;
		}

		string error_msg;
		auto success = VectorOperations::DefaultTryCast(chunk_p.data[i], cast_chunk.data[i], size, &error_msg);
		if (!success) {
			throw InvalidInputException("type mismatch in AppendDataChunk, expected %s, got %s for column %d",
			                            appender_types[i].ToString(), chunk_p.data[i].GetType().ToString(), i);
		}
	}

	collection->Append(cast_chunk);
	if (collection->Count() >= flush_count) {
		Flush();
	}
}